

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QString>::begin(QList<QString> *this)

{
  QString *n;
  QArrayDataPointer<QString> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QString> *)0x296629);
  QArrayDataPointer<QString>::operator->(in_RDI);
  n = QArrayDataPointer<QString>::begin((QArrayDataPointer<QString> *)0x29663a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }